

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_test.cpp
# Opt level: O3

void __thiscall
ParserTest_ParsesDoubles_Test::~ParserTest_ParsesDoubles_Test(ParserTest_ParsesDoubles_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTest, ParsesDoubles) {
  P parser;
  double vDouble = 0.0;
  ASSERT_TRUE(parser.parseDouble("value = 100.", vDouble));
  EXPECT_DOUBLE_EQ(100., vDouble);
  ASSERT_TRUE(parser.parseDouble("value = 100.0000", vDouble));
  EXPECT_DOUBLE_EQ(100., vDouble);
  ASSERT_TRUE(parser.parseDouble("value = 0.0000", vDouble));
  EXPECT_DOUBLE_EQ(0., vDouble);
  ASSERT_TRUE(parser.parseDouble("value = -0.0000", vDouble));
  EXPECT_DOUBLE_EQ(0., vDouble);
  ASSERT_TRUE(parser.parseDouble("value = 1.0e-2", vDouble));
  EXPECT_DOUBLE_EQ(0.01, vDouble);
  ASSERT_TRUE(parser.parseDouble("value = 1.0E-2", vDouble));
  EXPECT_DOUBLE_EQ(0.01, vDouble);
  ASSERT_TRUE(parser.parseDouble("value = 1e-2", vDouble));
  EXPECT_DOUBLE_EQ(0.01, vDouble);
  ASSERT_TRUE(parser.parseDouble("value = 1E-2", vDouble));
  EXPECT_DOUBLE_EQ(0.01, vDouble);
  ASSERT_TRUE(parser.parseDouble("value = 100", vDouble));
  EXPECT_DOUBLE_EQ(100, vDouble);
  ASSERT_TRUE(parser.parseDouble("value = '100.0'", vDouble));
  EXPECT_DOUBLE_EQ(100, vDouble);
}